

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
std::tr1::
tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
::tuple(tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
        *this,type f0,type f1)

{
  Matcher<char_*> *in_RDI;
  Matcher<char_*> *in_stack_ffffffffffffffc8;
  
  testing::Matcher<char_*>::Matcher(in_RDI,in_stack_ffffffffffffffc8);
  testing::Matcher<unsigned_long>::Matcher
            ((Matcher<unsigned_long> *)in_RDI,(Matcher<unsigned_long> *)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

explicit tuple(GTEST_BY_REF_(T0) f0, GTEST_BY_REF_(T1) f1) : f0_(f0),
      f1_(f1) {}